

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O0

int OpenMD::lexi_cast<int>(string *str)

{
  byte bVar1;
  long *plVar2;
  ostream *this;
  string *in_RDI;
  istringstream iss;
  int result;
  istringstream local_190 [388];
  int local_c [3];
  
  std::__cxx11::istringstream::istringstream(local_190,in_RDI,_S_in);
  plVar2 = (long *)std::istream::operator>>(local_190,local_c);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this = std::operator<<((ostream *)&std::cerr,"lexi_cast Error");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::istringstream::~istringstream(local_190);
  return local_c[0];
}

Assistant:

T lexi_cast(const std::string& str) {
    T result;
    std::istringstream iss(str);
    if (!(iss >> result)) { std::cerr << "lexi_cast Error" << std::endl; }
    return result;
  }